

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

void __thiscall
S2Polygon::S2Polygon
          (S2Polygon *this,unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *loop,S2Debug override)

{
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> local_38 [3];
  S2Debug local_19;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *puStack_18;
  S2Debug override_local;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *loop_local;
  S2Polygon *this_local;
  
  local_19 = override;
  puStack_18 = loop;
  loop_local = (unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)this;
  S2Region::S2Region(&this->super_S2Region);
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Polygon_0062ea50;
  std::
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ::vector(&this->loops_);
  this->s2debug_override_ = local_19;
  S2LatLngRect::S2LatLngRect(&this->bound_);
  S2LatLngRect::S2LatLngRect(&this->subregion_bound_);
  MutableS2ShapeIndex::MutableS2ShapeIndex(&this->index_);
  std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::unique_ptr(local_38,loop);
  Init(this,local_38);
  std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::~unique_ptr(local_38);
  return;
}

Assistant:

S2Polygon::S2Polygon(unique_ptr<S2Loop> loop, S2Debug override)
    : s2debug_override_(override) {
  Init(std::move(loop));
}